

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void ZSTD_updateStats(optState_t *optPtr,U32 litLength,BYTE *literals,U32 offsetCode,U32 matchLength
                     )

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  if (optPtr->literalCompressionMode != ZSTD_lcm_uncompressed) {
    if (litLength != 0) {
      puVar1 = optPtr->litFreq;
      uVar4 = 0;
      do {
        puVar1[literals[uVar4]] = puVar1[literals[uVar4]] + 2;
        uVar4 = uVar4 + 1;
      } while (litLength != uVar4);
    }
    optPtr->litSum = optPtr->litSum + litLength * 2;
  }
  if (litLength < 0x40) {
    uVar3 = (uint)(byte)ZSTD_LLcode(unsigned_int)::LL_Code[litLength];
  }
  else {
    uVar3 = 0x1f;
    if (litLength != 0) {
      for (; litLength >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar3 = (uVar3 ^ 0xffffffe0) + 0x33;
  }
  optPtr->litLengthFreq[uVar3] = optPtr->litLengthFreq[uVar3] + 1;
  optPtr->litLengthSum = optPtr->litLengthSum + 1;
  uVar3 = offsetCode + 1;
  if (uVar3 != 0) {
    uVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    optPtr->offCodeFreq[uVar2] = optPtr->offCodeFreq[uVar2] + 1;
    optPtr->offCodeSum = optPtr->offCodeSum + 1;
    uVar3 = matchLength - 3;
    if (uVar3 < 0x80) {
      uVar3 = (uint)(byte)(&ZSTD_MLcode(unsigned_int)::ML_Code)[uVar3];
    }
    else {
      uVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      uVar3 = (uVar2 ^ 0xffffffe0) + 0x44;
    }
    optPtr->matchLengthFreq[uVar3] = optPtr->matchLengthFreq[uVar3] + 1;
    optPtr->matchLengthSum = optPtr->matchLengthSum + 1;
    return;
  }
  __assert_fail("val != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x12c2,"U32 ZSTD_highbit32(U32)");
}

Assistant:

static void ZSTD_updateStats(optState_t* const optPtr,
                             U32 litLength, const BYTE* literals,
                             U32 offsetCode, U32 matchLength)
{
    /* literals */
    if (ZSTD_compressedLiterals(optPtr)) {
        U32 u;
        for (u=0; u < litLength; u++)
            optPtr->litFreq[literals[u]] += ZSTD_LITFREQ_ADD;
        optPtr->litSum += litLength*ZSTD_LITFREQ_ADD;
    }

    /* literal Length */
    {   U32 const llCode = ZSTD_LLcode(litLength);
        optPtr->litLengthFreq[llCode]++;
        optPtr->litLengthSum++;
    }

    /* match offset code (0-2=>repCode; 3+=>offset+2) */
    {   U32 const offCode = ZSTD_highbit32(offsetCode+1);
        assert(offCode <= MaxOff);
        optPtr->offCodeFreq[offCode]++;
        optPtr->offCodeSum++;
    }

    /* match Length */
    {   U32 const mlBase = matchLength - MINMATCH;
        U32 const mlCode = ZSTD_MLcode(mlBase);
        optPtr->matchLengthFreq[mlCode]++;
        optPtr->matchLengthSum++;
    }
}